

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_divsw_m68k(CPUM68KState_conflict *env,int destr,int32_t den)

{
  long lVar1;
  uint uVar2;
  uint32_t uVar3;
  uintptr_t unaff_retaddr;
  
  if (den != 0) {
    uVar3 = env->dregs[destr];
    lVar1 = (long)(int)uVar3 / (long)den;
    uVar2 = (uint)lVar1;
    env->cc_c = 0;
    if ((int)(short)lVar1 == uVar2) {
      env->dregs[destr] = (int)uVar3 % den << 0x10 | uVar2 & 0xffff;
      env->cc_n = uVar2;
      uVar3 = 0;
    }
    else {
      uVar3 = 0xffffffff;
      uVar2 = 1;
    }
    env->cc_z = uVar2;
    env->cc_v = uVar3;
    return;
  }
  *(undefined4 *)(env[-3].fregs + 2) = 5;
  cpu_loop_exit_restore_m68k((CPUState *)(env[-0x40].fregs + 2),unaff_retaddr);
}

Assistant:

void HELPER(divsw)(CPUM68KState *env, int destr, int32_t den)
{
    int32_t num = env->dregs[destr];
    uint32_t quot, rem;

    if (den == 0) {
        raise_exception_ra(env, EXCP_DIV0, GETPC());
    }
    quot = num / den;
    rem = num % den;

    env->cc_c = 0; /* always cleared, even if overflow */
    if (quot != (int16_t)quot) {
        env->cc_v = -1;
        /* nothing else is modified */
        /*
         * real 68040 keeps N and unset Z on overflow,
         * whereas documentation says "undefined"
         */
        env->cc_z = 1;
        return;
    }
    env->dregs[destr] = deposit32(quot, 16, 16, rem);
    env->cc_z = (int16_t)quot;
    env->cc_n = (int16_t)quot;
    env->cc_v = 0;
}